

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tspm.cpp
# Opt level: O1

void __thiscall pg::TSPMSolver::Prog(TSPMSolver *this,int *dst,int *src,int d,int pl)

{
  long lVar1;
  int *piVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  bool bVar7;
  
  uVar4 = (ulong)(uint)pl;
  uVar3 = (ulong)pl;
  if (src[uVar3] != -1) {
    if (pl < d) {
      uVar4 = uVar3;
      do {
        dst[uVar4] = 0;
        uVar4 = uVar4 + 2;
      } while ((long)uVar4 < (long)d);
    }
    bVar7 = (int)uVar4 == d;
    lVar1 = this->k;
    lVar5 = (long)(int)uVar4;
    if (lVar5 < lVar1) {
      piVar2 = this->counts;
      do {
        iVar6 = (uint)bVar7 + src[lVar5];
        bVar7 = piVar2[lVar5] < iVar6;
        if (piVar2[lVar5] < iVar6) {
          iVar6 = 0;
        }
        dst[lVar5] = iVar6;
        lVar5 = lVar5 + 2;
      } while (lVar5 < lVar1);
    }
    if (!bVar7) {
      return;
    }
  }
  dst[uVar3] = -1;
  return;
}

Assistant:

void
TSPMSolver::Prog(int *dst, int *src, int d, int pl)
{
    // check if top
    if (src[pl] == -1) {
        dst[pl] = -1;
        return;
    }

    // set every value lower than <d> to 0.
    int i = pl;
    for (; i<d; i+=2) dst[i] = 0;

    int carry = (d == i) ? 1 : 0; // only increase if <d> has parity <pl>

    for (; i<k; i+=2) {
        // increase or copy for same parity
        int v = src[i] + carry;
        if (v > counts[i]) {
            dst[i] = 0;
            carry = 1;
        } else {
            dst[i] = v;
            carry = 0;
        }
    }

    // check if top
    if (carry) dst[pl] = -1;
}